

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolInfo.cpp
# Opt level: O2

void __thiscall ClassInfo::Print(ClassInfo *this,ofstream *out)

{
  bool bVar1;
  ostream *poVar2;
  __node_base *p_Var3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>
  elem;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>
  local_60;
  
  poVar2 = std::operator<<((ostream *)out,"\t");
  poVar2 = std::operator<<(poVar2,"name: ");
  poVar2 = std::operator<<(poVar2,(string *)this);
  std::operator<<(poVar2,"\n");
  bVar1 = std::operator!=(&this->baseClass,"");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)out,"\t");
    poVar2 = std::operator<<(poVar2,"base: ");
    poVar2 = std::operator<<(poVar2,(string *)&this->baseClass);
    std::operator<<(poVar2,"\n");
  }
  poVar2 = std::operator<<((ostream *)out,"\t");
  poVar2 = std::operator<<(poVar2,"fields: {");
  std::operator<<(poVar2,"\n");
  VariablesInfo::Print
            ((this->fields).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,out
            );
  poVar2 = std::operator<<((ostream *)out,"\t");
  poVar2 = std::operator<<(poVar2,"} ");
  std::operator<<(poVar2,"\n");
  p_Var3 = &(this->methods)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>
    ::pair(&local_60,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>
            *)(p_Var3 + 1));
    poVar2 = std::operator<<((ostream *)out,"\t");
    poVar2 = std::operator<<(poVar2,"method: {");
    std::operator<<(poVar2,"\n");
    MethodInfo::Print(local_60.second.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,out);
    poVar2 = std::operator<<((ostream *)out,"\t");
    poVar2 = std::operator<<(poVar2,"} ");
    std::operator<<(poVar2,"\n");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>
    ::~pair(&local_60);
  }
  return;
}

Assistant:

void ClassInfo::Print( std::ofstream& out )
{
	out << "\t" << "name: " << name << "\n";
	if( baseClass != "" ) {
		out << "\t" << "base: " << baseClass << "\n";
	}
	out << "\t" << "fields: {" << "\n";
	fields->Print( out );
	out << "\t" << "} " << "\n";
	for( auto elem : methods ) {
		out << "\t" << "method: {" << "\n";
		(elem.second)->Print( out );
		out << "\t" << "} " << "\n";
	}
}